

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O3

int htmlSaveFileFormat(char *filename,xmlDocPtr cur,char *encoding,int format)

{
  xmlCharEncoding xVar1;
  int iVar2;
  xmlCharEncodingHandlerPtr encoder;
  xmlOutputBufferPtr buf;
  undefined4 in_register_0000000c;
  char *encoding_00;
  
  encoding_00 = (char *)CONCAT71((int7)(CONCAT44(in_register_0000000c,format) >> 8),
                                 filename == (char *)0x0 || cur == (xmlDocPtr)0x0);
  iVar2 = -1;
  if (filename != (char *)0x0 && cur != (xmlDocPtr)0x0) {
    xmlInitParser();
    if (encoding == (char *)0x0) {
      htmlSetMetaEncoding(cur,"UTF-8");
      encoder = xmlFindCharEncodingHandler("HTML");
      if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
        encoder = xmlFindCharEncodingHandler("ascii");
      }
    }
    else {
      xVar1 = xmlParseCharEncoding(encoding);
      if (xVar1 == XML_CHAR_ENCODING_UTF8) {
        encoder = (xmlCharEncodingHandlerPtr)0x0;
      }
      else {
        encoder = xmlFindCharEncodingHandler(encoding);
        if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
          encoding_00 = "unknown encoding %s\n";
          encoder = (xmlCharEncodingHandlerPtr)0x0;
          __xmlSimpleError(7,0x57b,(xmlNodePtr)0x0,"unknown encoding %s\n",encoding);
        }
      }
      htmlSetMetaEncoding(cur,(xmlChar *)encoding);
    }
    iVar2 = 0;
    buf = xmlOutputBufferCreateFilename(filename,encoder,0);
    if (buf != (xmlOutputBufferPtr)0x0) {
      htmlNodeDumpFormatOutput(buf,cur,(xmlNodePtr)cur,encoding_00,format);
      iVar2 = xmlOutputBufferClose(buf);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int
htmlSaveFileFormat(const char *filename, xmlDocPtr cur,
	           const char *encoding, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    if (encoding != NULL) {
	xmlCharEncoding enc;

	enc = xmlParseCharEncoding(encoding);
	if (enc != XML_CHAR_ENCODING_UTF8) {
	    handler = xmlFindCharEncodingHandler(encoding);
	    if (handler == NULL)
		htmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL, encoding);
	}
        htmlSetMetaEncoding(cur, (const xmlChar *) encoding);
    } else {
	htmlSetMetaEncoding(cur, (const xmlChar *) "UTF-8");

        /*
         * Fallback to HTML or ASCII when the encoding is unspecified
         */
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("HTML");
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("ascii");
    }

    /*
     * save the content to a temp buffer.
     */
    buf = xmlOutputBufferCreateFilename(filename, handler, 0);
    if (buf == NULL) return(0);

    htmlDocContentDumpFormatOutput(buf, cur, encoding, format);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}